

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multikey_simd.cpp
# Opt level: O3

void multikey_simd_b<unsigned_char>
               (uchar **strings,size_t N,size_t depth,uchar **sorted,uint8_t *oracle)

{
  byte *pbVar1;
  long lVar2;
  uchar *puVar3;
  uchar *puVar4;
  int iVar5;
  size_t sVar6;
  size_t sVar7;
  byte bVar8;
  ulong uVar9;
  long lVar10;
  uchar **ppuVar11;
  ulong uVar12;
  uchar **ppuVar13;
  long lVar14;
  byte bVar15;
  byte bVar17;
  byte bVar18;
  byte bVar19;
  undefined1 auVar16 [16];
  uchar data00 [16];
  byte local_88 [8];
  undefined8 uStack_80;
  long local_78;
  undefined1 local_68 [16];
  ulong local_58;
  size_t local_50;
  size_t local_48;
  ulong local_40;
  size_t local_38;
  
  if (0x1f < N) {
    local_50 = depth + 1;
    do {
      bVar8 = pseudo_median<unsigned_char>(strings,N,depth);
      local_68 = (undefined1  [16])0x0;
      local_58 = 0;
      uVar9 = N & 0xfffffffffffffff0;
      if (uVar9 != 0) {
        auVar16 = ZEXT216(CONCAT11(bVar8 + 0x80,bVar8 + 0x80));
        auVar16 = pshuflw(auVar16,auVar16,0);
        uVar12 = 0;
        ppuVar11 = strings;
        do {
          lVar14 = 0;
          do {
            lVar14 = lVar14 + 1;
          } while (lVar14 != 0x10);
          lVar14 = 0;
          do {
            local_88[lVar14] = ppuVar11[lVar14][depth];
            lVar14 = lVar14 + 1;
          } while (lVar14 != 0x10);
          bVar15 = auVar16[0];
          bVar17 = auVar16[1];
          bVar18 = auVar16[2];
          bVar19 = auVar16[3];
          pbVar1 = oracle + uVar12;
          *pbVar1 = -((char)bVar15 < (char)(local_88[0] ^ 0x80)) & 2U |
                    -((local_88[0] ^ 0x80) == bVar15) & 1U;
          pbVar1[1] = -((char)bVar17 < (char)(local_88[1] ^ 0x80)) & 2U |
                      -((local_88[1] ^ 0x80) == bVar17) & 1U;
          pbVar1[2] = -((char)bVar18 < (char)(local_88[2] ^ 0x80)) & 2U |
                      -((local_88[2] ^ 0x80) == bVar18) & 1U;
          pbVar1[3] = -((char)bVar19 < (char)(local_88[3] ^ 0x80)) & 2U |
                      -((local_88[3] ^ 0x80) == bVar19) & 1U;
          pbVar1[4] = -((char)bVar15 < (char)(local_88[4] ^ 0x80)) & 2U |
                      -((local_88[4] ^ 0x80) == bVar15) & 1U;
          pbVar1[5] = -((char)bVar17 < (char)(local_88[5] ^ 0x80)) & 2U |
                      -((local_88[5] ^ 0x80) == bVar17) & 1U;
          pbVar1[6] = -((char)bVar18 < (char)(local_88[6] ^ 0x80)) & 2U |
                      -((local_88[6] ^ 0x80) == bVar18) & 1U;
          pbVar1[7] = -((char)bVar19 < (char)(local_88[7] ^ 0x80)) & 2U |
                      -((local_88[7] ^ 0x80) == bVar19) & 1U;
          pbVar1[8] = -((char)bVar15 < (char)((byte)uStack_80 ^ 0x80)) & 2U |
                      -(((byte)uStack_80 ^ 0x80) == bVar15) & 1U;
          pbVar1[9] = -((char)bVar17 < (char)(uStack_80._1_1_ ^ 0x80)) & 2U |
                      -((uStack_80._1_1_ ^ 0x80) == bVar17) & 1U;
          pbVar1[10] = -((char)bVar18 < (char)(uStack_80._2_1_ ^ 0x80)) & 2U |
                       -((uStack_80._2_1_ ^ 0x80) == bVar18) & 1U;
          pbVar1[0xb] = -((char)bVar19 < (char)(uStack_80._3_1_ ^ 0x80)) & 2U |
                        -((uStack_80._3_1_ ^ 0x80) == bVar19) & 1U;
          pbVar1[0xc] = -((char)bVar15 < (char)(uStack_80._4_1_ ^ 0x80)) & 2U |
                        -((uStack_80._4_1_ ^ 0x80) == bVar15) & 1U;
          pbVar1[0xd] = -((char)bVar17 < (char)(uStack_80._5_1_ ^ 0x80)) & 2U |
                        -((uStack_80._5_1_ ^ 0x80) == bVar17) & 1U;
          pbVar1[0xe] = -((char)bVar18 < (char)(uStack_80._6_1_ ^ 0x80)) & 2U |
                        -((uStack_80._6_1_ ^ 0x80) == bVar18) & 1U;
          pbVar1[0xf] = -((char)bVar19 < (char)(uStack_80._7_1_ ^ 0x80)) & 2U |
                        -((uStack_80._7_1_ ^ 0x80) == bVar19) & 1U;
          uVar12 = uVar12 + 0x10;
          ppuVar11 = ppuVar11 + 0x10;
        } while (uVar12 < uVar9);
      }
      if (uVar9 != N) {
        do {
          if (strings[uVar9] == (uchar *)0x0) {
            __assert_fail("ptr",
                          "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                          ,0x26,"unsigned char get_char(unsigned char *, size_t)");
          }
          bVar15 = strings[uVar9][depth];
          oracle[uVar9] = (bVar8 <= bVar15 && bVar15 != bVar8) * '\x02' | bVar15 == bVar8;
          uVar9 = uVar9 + 1;
        } while (uVar9 < N);
      }
      lVar10 = N + (N == 0);
      lVar14 = 0;
      do {
        *(long *)(local_68 + (ulong)oracle[lVar14] * 8) =
             *(long *)(local_68 + (ulong)oracle[lVar14] * 8) + 1;
        lVar14 = lVar14 + 1;
      } while (lVar10 != lVar14);
      local_38 = local_68._8_8_;
      if (local_68._8_8_ + local_68._0_8_ + local_58 != N) {
        __assert_fail("bucketsize[0] + bucketsize[1] + bucketsize[2] == N",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/multikey_simd.cpp"
                      ,0x166,
                      "void multikey_simd_b(unsigned char **, size_t, size_t, unsigned char **__restrict, uint8_t *__restrict) [CharT = unsigned char]"
                     );
      }
      local_40 = local_58;
      local_88[0] = 0;
      local_88[1] = 0;
      local_88[2] = 0;
      local_88[3] = 0;
      local_88[4] = 0;
      local_88[5] = 0;
      local_88[6] = 0;
      local_88[7] = 0;
      local_48 = local_68._0_8_;
      uStack_80 = local_68._0_8_;
      local_78 = local_68._8_8_ + local_68._0_8_;
      lVar14 = 0;
      do {
        puVar3 = strings[lVar14];
        pbVar1 = oracle + lVar14;
        lVar14 = lVar14 + 1;
        lVar2 = *(long *)(local_88 + (ulong)*pbVar1 * 8);
        *(long *)(local_88 + (ulong)*pbVar1 * 8) = lVar2 + 1;
        sorted[lVar2] = puVar3;
      } while (lVar10 != lVar14);
      memcpy(strings,sorted,N << 3);
      sVar6 = local_48;
      multikey_simd_b<unsigned_char>(strings,local_48,depth,sorted,oracle);
      sVar7 = local_38;
      if (bVar8 != 0) {
        multikey_simd_b<unsigned_char>(strings + sVar6,local_38,local_50,sorted,oracle);
      }
      strings = strings + sVar6 + sVar7;
      N = local_40;
    } while (0x1f < local_40);
  }
  if (1 < N) {
    ppuVar11 = strings;
    do {
      puVar3 = ppuVar11[1];
      ppuVar11 = ppuVar11 + 1;
      for (ppuVar13 = ppuVar11; strings < ppuVar13; ppuVar13 = ppuVar13 + -1) {
        puVar4 = ppuVar13[-1];
        bVar8 = puVar4[depth];
        bVar15 = puVar3[depth];
        if ((bVar8 != 0) && (lVar14 = depth + 1, bVar8 == bVar15)) {
          do {
            bVar8 = puVar4[lVar14];
            bVar15 = puVar3[lVar14];
            if (bVar8 == 0) break;
            lVar14 = lVar14 + 1;
          } while (bVar8 == bVar15);
        }
        if (bVar8 <= bVar15) break;
        *ppuVar13 = puVar4;
      }
      iVar5 = (int)N;
      *ppuVar13 = puVar3;
      N = (size_t)(iVar5 - 1);
    } while (2 < iVar5);
  }
  return;
}

Assistant:

static void
multikey_simd_b(unsigned char** strings, size_t N, size_t depth,
		unsigned char** restrict sorted, uint8_t* restrict oracle)
{
	if (N < 32) {
		insertion_sort(strings, N, depth);
		return;
	}
	CharT partval = pseudo_median<CharT>(strings, N, depth);
	std::array<size_t, 3> bucketsize;
	bucketsize.fill(0);
	size_t i=N-N%16;
	calculate_bucketsizes_sse<true>(strings, i, oracle, partval, depth);
	for (; i < N; ++i)
		oracle[i] = get_bucket(
				get_char<CharT>(strings[i], depth),
				partval);
	for (i=0; i < N; ++i) {
		__builtin_prefetch(&oracle[i+1]);
		++bucketsize[oracle[i]];
	}
	assert(bucketsize[0] + bucketsize[1] + bucketsize[2] == N);
	size_t bucketindex[3];
	bucketindex[0] = 0;
	bucketindex[1] = bucketsize[0];
	bucketindex[2] = bucketsize[0] + bucketsize[1];
	for (size_t i=0; i < N; ++i) {
		__builtin_prefetch(&oracle[i+1]);
		sorted[bucketindex[oracle[i]]++] = strings[i];
	}
	std::copy(sorted, sorted+N, strings);
	multikey_simd_b<CharT>(strings, bucketsize[0], depth,
			sorted, oracle);
	if (not is_end(partval))
		multikey_simd_b<CharT>(strings+bucketsize[0],
				bucketsize[1], depth+sizeof(CharT),
				sorted, oracle);
	multikey_simd_b<CharT>(strings+bucketsize[0]+bucketsize[1],
			bucketsize[2], depth, sorted, oracle);
}